

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

Value * __thiscall
soul::Value::cloneWithEquivalentType(Value *__return_storage_ptr__,Value *this,Type *newType)

{
  bool bVar1;
  void *sourceData;
  Type local_60;
  Type local_38;
  Type *local_20;
  Type *newType_local;
  Value *this_local;
  
  local_20 = newType;
  newType_local = &this->type;
  this_local = __return_storage_ptr__;
  bVar1 = Type::hasIdenticalLayout(newType,&this->type);
  checkAssertion(bVar1,"newType.hasIdenticalLayout (type)","cloneWithEquivalentType",0x296);
  bVar1 = isZero(this);
  if (bVar1) {
    Type::Type(&local_38,newType);
    Value(__return_storage_ptr__,&local_38);
    Type::~Type(&local_38);
  }
  else {
    Type::Type(&local_60,newType);
    sourceData = getPackedData(this);
    Value(__return_storage_ptr__,&local_60,sourceData);
    Type::~Type(&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::cloneWithEquivalentType (Type newType) const
{
    SOUL_ASSERT (newType.hasIdenticalLayout (type));

    if (isZero())
        return Value (std::move (newType));

    return Value (std::move (newType), getPackedData());
}